

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmwindow.cpp
# Opt level: O2

void __thiscall QEglFSKmsGbmWindow::resetSurface(QEglFSKmsGbmWindow *this)

{
  long lVar1;
  void *pvVar2;
  QEglFSKmsGbmIntegration *pQVar3;
  char cVar4;
  QEglFSKmsGbmScreen *this_00;
  QSurfaceFormat *pQVar5;
  gbm_surface *pgVar6;
  char *pcVar7;
  char *pcVar8;
  code *pcVar9;
  long lVar10;
  undefined8 uVar11;
  long in_FS_OFFSET;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  undefined8 local_60;
  QArrayDataPointer<int> local_58;
  QSurfaceFormat platformFormat;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QEglFSKmsGbmScreen *)(**(code **)(*(long *)this + 0x18))();
  pvVar2 = *(void **)&this_00->field_0x10;
  _platformFormat = 0xaaaaaaaaaaaaaaaa;
  pQVar3 = this->m_integration;
  QPlatformWindow::window();
  QWindow::requestedFormat();
  (**(code **)(*(long *)pQVar3 + 0x90))(&platformFormat,pQVar3,&local_78);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_78);
  pQVar5 = (QSurfaceFormat *)QEglFSDeviceIntegration::chooseConfig(pvVar2,&platformFormat);
  *(QSurfaceFormat **)&this->field_0x48 = pQVar5;
  q_glFormatFromConfig(&local_78,pvVar2,pQVar5);
  QSurfaceFormat::operator=((QSurfaceFormat *)&this->field_0x50,(QSurfaceFormat *)&local_78);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_78);
  pgVar6 = QEglFSKmsGbmScreen::createSurface(this_00,*(EGLConfig *)&this->field_0x48);
  *(gbm_surface **)&this->field_0x40 = pgVar6;
  pcVar7 = (char *)eglQueryString(0,0x3055);
  if (pcVar7 != (char *)0x0) {
    pcVar8 = strstr(pcVar7,"EGL_KHR_platform_gbm");
    if (pcVar8 == (char *)0x0) {
      pcVar7 = strstr(pcVar7,"EGL_MESA_platform_gbm");
      if (pcVar7 == (char *)0x0) goto LAB_0011428e;
    }
    pcVar9 = (code *)eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT");
    if (pcVar9 != (code *)0x0) {
      local_58.d = (Data *)0x0;
      local_58.ptr = (int *)0x0;
      local_58.size = 0;
      cVar4 = QSurfaceFormat::testOption((FormatOption)&platformFormat);
      if (cVar4 != '\0') {
        cVar4 = q_hasEglExtension(pvVar2,"EGL_EXT_protected_content");
        if (cVar4 == '\0') {
          QSurfaceFormat::setOption((FormatOption)&this->field_0x50,true);
        }
        else {
          QList<int>::append((QList<int> *)&local_58,0x32c0);
          QList<int>::append((QList<int> *)&local_58,1);
          lVar10 = QtPrivateLogging::qLcEglfsKmsDebug();
          if ((*(byte *)(lVar10 + 0x10) & 1) != 0) {
            local_60 = *(undefined8 *)(lVar10 + 8);
            local_78 = 2;
            local_74 = 0;
            uStack_6c = 0;
            local_64 = 0;
            QMessageLogger::debug
                      ((char *)&local_78,
                       "Enabled EGL_PROTECTED_CONTENT_EXT for eglCreatePlatformWindowSurfaceEXT");
          }
        }
      }
      QList<int>::append((QList<int> *)&local_58,0x3038);
      uVar11 = (*pcVar9)(pvVar2,*(undefined8 *)&this->field_0x48,*(undefined8 *)&this->field_0x40,
                         local_58.ptr);
      *(undefined8 *)&this->field_0x38 = uVar11;
      QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
      goto LAB_0011431b;
    }
  }
LAB_0011428e:
  lVar10 = QtPrivateLogging::qLcEglfsKmsDebug();
  if ((*(byte *)(lVar10 + 0x10) & 1) != 0) {
    local_60 = *(undefined8 *)(lVar10 + 8);
    local_78 = 2;
    local_74 = 0;
    uStack_6c = 0;
    local_64 = 0;
    QMessageLogger::debug
              ((char *)&local_78,
               "No eglCreatePlatformWindowSurface for GBM, falling back to eglCreateWindowSurface");
  }
  uVar11 = eglCreateWindowSurface
                     (pvVar2,*(undefined8 *)&this->field_0x48,*(undefined8 *)&this->field_0x40,0);
  *(undefined8 *)&this->field_0x38 = uVar11;
LAB_0011431b:
  QSurfaceFormat::~QSurfaceFormat(&platformFormat);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsGbmWindow::resetSurface()
{
    QEglFSKmsGbmScreen *gbmScreen = static_cast<QEglFSKmsGbmScreen *>(screen());
    EGLDisplay display = gbmScreen->display();
    QSurfaceFormat platformFormat = m_integration->surfaceFormatFor(window()->requestedFormat());
    m_config = QEglFSDeviceIntegration::chooseConfig(display, platformFormat);
    m_format = q_glFormatFromConfig(display, m_config, platformFormat);
    // One fullscreen window per screen -> the native window is simply the gbm_surface the screen created.
    m_window = reinterpret_cast<EGLNativeWindowType>(gbmScreen->createSurface(m_config));

    PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC createPlatformWindowSurface = nullptr;
    const char *extensions = eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
    if (extensions && (strstr(extensions, "EGL_KHR_platform_gbm") || strstr(extensions, "EGL_MESA_platform_gbm"))) {
        createPlatformWindowSurface = reinterpret_cast<PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC>(
            eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT"));
    }

    if (createPlatformWindowSurface) {
        QVector<EGLint> contextAttributes;
#ifdef EGL_EXT_protected_content
        if (platformFormat.testOption(QSurfaceFormat::ProtectedContent)) {
            if (q_hasEglExtension(display, "EGL_EXT_protected_content")) {
                contextAttributes.append(EGL_PROTECTED_CONTENT_EXT);
                contextAttributes.append(EGL_TRUE);
                qCDebug(qLcEglfsKmsDebug, "Enabled EGL_PROTECTED_CONTENT_EXT for eglCreatePlatformWindowSurfaceEXT");
            } else {
                m_format.setOption(QSurfaceFormat::ProtectedContent, false);
            }
        }
#endif
        contextAttributes.append(EGL_NONE);

        m_surface = createPlatformWindowSurface(display, m_config, reinterpret_cast<void *>(m_window), contextAttributes.constData());
    } else {
        qCDebug(qLcEglfsKmsDebug, "No eglCreatePlatformWindowSurface for GBM, falling back to eglCreateWindowSurface");
        m_surface = eglCreateWindowSurface(display, m_config, m_window, nullptr);
    }
}